

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O2

string * __thiscall cnn::Cluster::toString_abi_cxx11_(string *__return_storage_ptr__,Cluster *this)

{
  uint uVar1;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  for (uVar1 = 0;
      (ulong)uVar1 <
      (ulong)((long)(this->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2); uVar1 = uVar1 + 1) {
    if ((ulong)uVar1 != 0) {
      std::operator<<(local_1a0," ");
    }
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

string Cluster::toString() const {
  stringstream ss;
  for (unsigned i = 0; i < path.size(); ++i) {
    if (i != 0) {
      ss << " ";
    }
    ss << path[i];
  }
  return ss.str();
}